

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repattrn.cpp
# Opt level: O2

UBool __thiscall icu_63::RegexPattern::operator==(RegexPattern *this,RegexPattern *other)

{
  UText *ut;
  long lVar1;
  UBool UVar2;
  UText *ut_00;
  
  if ((this->fFlags == other->fFlags) && (this->fDeferredStatus == other->fDeferredStatus)) {
    if ((this->fPatternString != (UnicodeString *)0x0) &&
       (other->fPatternString != (UnicodeString *)0x0)) {
      UVar2 = UnicodeString::operator==(this->fPatternString,other->fPatternString);
      return UVar2;
    }
    ut = this->fPattern;
    ut_00 = other->fPattern;
    if (ut == (UText *)0x0) {
      if (ut_00 == (UText *)0x0) {
        return '\x01';
      }
    }
    else if (ut_00 != (UText *)0x0) {
      lVar1 = ut->chunkNativeStart;
      if (((lVar1 < 1) && (-lVar1 < (long)ut->nativeIndexingLimit)) &&
         ((ushort)ut->chunkContents[-lVar1] < 0xdc00)) {
        ut->chunkOffset = (int32_t)-lVar1;
      }
      else {
        utext_setNativeIndex_63(ut,0);
        ut_00 = other->fPattern;
      }
      lVar1 = ut_00->chunkNativeStart;
      if (((lVar1 < 1) && (-lVar1 < (long)ut_00->nativeIndexingLimit)) &&
         ((ushort)ut_00->chunkContents[-lVar1] < 0xdc00)) {
        ut_00->chunkOffset = (int32_t)-lVar1;
      }
      else {
        utext_setNativeIndex_63(ut_00,0);
        ut_00 = other->fPattern;
      }
      UVar2 = utext_equals_63(this->fPattern,ut_00);
      return UVar2;
    }
  }
  return '\0';
}

Assistant:

UBool   RegexPattern::operator ==(const RegexPattern &other) const {
    if (this->fFlags == other.fFlags && this->fDeferredStatus == other.fDeferredStatus) {
        if (this->fPatternString != NULL && other.fPatternString != NULL) {
            return *(this->fPatternString) == *(other.fPatternString);
        } else if (this->fPattern == NULL) {
            if (other.fPattern == NULL) {
                return TRUE;
            }
        } else if (other.fPattern != NULL) {
            UTEXT_SETNATIVEINDEX(this->fPattern, 0);
            UTEXT_SETNATIVEINDEX(other.fPattern, 0);
            return utext_equals(this->fPattern, other.fPattern);
        }
    }
    return FALSE;
}